

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# opennurbs_xml.cpp
# Opt level: O2

void __thiscall ON_XMLNode::RemoveAllProperties(ON_XMLNode *this)

{
  recursive_mutex *__mutex;
  
  __mutex = &this->_private->m_mutex;
  std::recursive_mutex::lock(__mutex);
  ON_XMLNodePrivate::RemoveAllProperties(this->_private);
  ON_XMLNodePrivate::AddEmptyDefaultProperty(this->_private);
  pthread_mutex_unlock((pthread_mutex_t *)__mutex);
  return;
}

Assistant:

void ON_XMLNode::RemoveAllProperties(void)
{
  std::lock_guard<std::recursive_mutex> lg(_private->m_mutex);

  _private->RemoveAllProperties();
  _private->AddEmptyDefaultProperty();
}